

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O2

bool tinyobj::exportGroupsToShape
               (shape_t *shape,PrimGroup *prim_group,
               vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> *tags,int material_id,
               string *name,bool triangulate,vector<float,_std::allocator<float>_> *v)

{
  vector<int,_std::allocator<int>_> *this;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  pointer pvVar1;
  pointer pfVar2;
  undefined8 uVar3;
  pointer pfVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  pointer p_Var9;
  pointer p_Var10;
  ulong uVar11;
  pointer pvVar12;
  pointer p_Var13;
  pointer p_Var14;
  long lVar15;
  ulong uVar16;
  mesh_t *pmVar17;
  ulong uVar18;
  ulong uVar19;
  undefined7 in_register_00000089;
  int *piVar20;
  size_t k;
  long lVar21;
  ulong uVar22;
  size_t j_1;
  pointer pfVar23;
  face_t *__x;
  size_t j;
  ulong uVar24;
  bool bVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  long lStack_120;
  undefined1 local_108 [8];
  face_t remainingFace;
  float local_e0 [2];
  real_t vy [3];
  float local_b8 [2];
  real_t vx [3];
  index_t idx0;
  index_t idx1;
  index_t idx2;
  vertex_index_t ind [3];
  int local_4c;
  PrimGroup *pPStack_48;
  int material_id_local;
  mesh_t *local_40;
  byte local_32;
  uchar local_31;
  
  uVar24 = CONCAT71(in_register_00000089,triangulate) & 0xffffffff;
  local_4c = material_id;
  pPStack_48 = prim_group;
  local_32 = PrimGroup::IsEmpty(prim_group);
  if (!(bool)local_32) {
    std::__cxx11::string::_M_assign((string *)shape);
    pfVar23 = (pPStack_48->faceGroup).
              super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>._M_impl.
              super__Vector_impl_data._M_start;
    pfVar4 = (pPStack_48->faceGroup).
             super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pfVar23 != pfVar4) {
      local_40 = &shape->mesh;
      unique0x00004780 = &(shape->mesh).num_face_vertices;
      this = &(shape->mesh).material_ids;
      this_00 = &(shape->mesh).smoothing_group_ids;
      vy[1] = (real_t)CONCAT71(in_register_00000089,triangulate);
      for (pvVar12 = (pointer)0x0; pvVar12 < (pointer)((long)pfVar4 - (long)pfVar23 >> 5);
          pvVar12 = (pointer)((long)&pvVar12->v_idx + 1)) {
        pvVar1 = pfVar23[(long)pvVar12].vertex_indices.
                 super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar5 = ((long)pfVar23[(long)pvVar12].vertex_indices.
                       super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0xc;
        if (2 < uVar5) {
          __x = pfVar23 + (long)pvVar12;
          remainingFace.vertex_indices.
          super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = pvVar12;
          if ((char)uVar24 != '\0') {
            pfVar2 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            uVar18 = (long)(v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                           super__Vector_impl_data._M_finish - (long)pfVar2 >> 2;
            uVar24 = 1;
            uVar7 = uVar24;
            pvVar12 = pvVar1;
            while (-uVar5 + uVar7 != 1) {
              lVar21 = (long)pvVar12->v_idx;
              uVar11 = uVar7 + 1;
              if (lVar21 * 3 + 2U < uVar18) {
                if (uVar7 == uVar5) {
                  uVar7 = 0;
                }
                lVar6 = (long)pvVar1[uVar7].v_idx;
                if ((lVar6 * 3 + 2U < uVar18) &&
                   (lVar15 = (long)pvVar1[uVar11 % uVar5].v_idx, lVar15 * 3 + 2U < uVar18)) {
                  fVar31 = pfVar2[lVar15 * 3] - pfVar2[lVar6 * 3];
                  fVar30 = pfVar2[lVar6 * 3] - pfVar2[lVar21 * 3];
                  fVar27 = pfVar2[lVar15 * 3 + 1] - pfVar2[lVar6 * 3 + 1];
                  fVar29 = pfVar2[lVar6 * 3 + 1] - pfVar2[lVar21 * 3 + 1];
                  fVar32 = pfVar2[lVar15 * 3 + 2] - pfVar2[lVar6 * 3 + 2];
                  fVar26 = pfVar2[lVar6 * 3 + 2] - pfVar2[lVar21 * 3 + 2];
                  fVar28 = ABS(fVar29 * fVar32 - fVar27 * fVar26);
                  fVar26 = ABS(fVar26 * fVar31 - fVar32 * fVar30);
                  fVar27 = ABS(fVar27 * fVar30 - fVar29 * fVar31);
                  if ((1.1920929e-07 < fVar27) ||
                     ((1.1920929e-07 < fVar28 || (1.1920929e-07 < fVar26)))) {
                    if ((fVar28 <= fVar27) || (lStack_120 = 2, fVar28 <= fVar26)) {
                      lStack_120 = 2 - (ulong)(-(uint)(fVar28 < fVar27 && fVar26 < fVar27) & 1);
                      uVar24 = 0;
                    }
                    goto LAB_00114b01;
                  }
                }
              }
              pvVar12 = pvVar12 + 1;
              uVar7 = uVar11;
            }
            lStack_120 = 2;
LAB_00114b01:
            fVar26 = 0.0;
            uVar7 = 0;
LAB_00114b06:
            pvVar12 = pvVar1 + uVar7;
            do {
              uVar7 = uVar7 + 1;
              if (-uVar5 + uVar7 == 1) {
                face_t::face_t((face_t *)local_108,__x);
                idx2.normal_index = -1;
                idx2.texcoord_index = -1;
                uVar7 = ((long)(__x->vertex_indices).
                               super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(__x->vertex_indices).
                              super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0xc;
                uVar18 = 0;
                uVar5 = ((long)remainingFace.vertex_indices.
                               super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                               ._M_impl.super__Vector_impl_data._M_start - remainingFace._0_8_) /
                        0xc;
                goto LAB_00114bf7;
              }
              uVar11 = 0;
              if (uVar7 != uVar5) {
                uVar11 = uVar7;
              }
              lVar21 = (long)pvVar12->v_idx * 3;
              uVar19 = lVar21 + uVar24;
              if ((uVar19 < uVar18) && (uVar16 = lVar21 + lStack_120, uVar16 < uVar18)) {
                lVar21 = (long)pvVar1[uVar11].v_idx * 3;
                uVar11 = lVar21 + uVar24;
                if ((uVar11 < uVar18) && (uVar22 = lVar21 + lStack_120, uVar22 < uVar18))
                goto LAB_00114b68;
              }
              pvVar12 = pvVar12 + 1;
            } while( true );
          }
          lVar21 = 8;
          uVar7 = uVar5;
          while (bVar25 = uVar7 != 0, uVar7 = uVar7 - 1, bVar25) {
            pvVar12 = (__x->vertex_indices).
                      super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            idx2.normal_index = *(int *)((long)pvVar12 + lVar21 + -8);
            idx2.texcoord_index = *(int *)((long)&pvVar12->v_idx + lVar21);
            std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::push_back
                      (&local_40->indices,(value_type *)&idx2.normal_index);
            lVar21 = lVar21 + 0xc;
          }
          idx2.normal_index = CONCAT31(idx2.normal_index._1_3_,(char)uVar5);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (stack0xffffffffffffff30,(uchar *)&idx2.normal_index);
          std::vector<int,_std::allocator<int>_>::push_back(this,&local_4c);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (this_00,&__x->smoothing_group_id);
          pvVar12 = remainingFace.vertex_indices.
                    super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
        }
LAB_00114ff2:
        pfVar23 = (pPStack_48->faceGroup).
                  super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pfVar4 = (pPStack_48->faceGroup).
                 super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      std::vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>::operator=
                (&(shape->mesh).tags,tags);
    }
    p_Var13 = (pPStack_48->lineGroup).
              super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>._M_impl.
              super__Vector_impl_data._M_start;
    p_Var9 = (pPStack_48->lineGroup).
             super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (p_Var13 != p_Var9) {
      pmVar17 = (mesh_t *)0x0;
      while (pmVar17 < (undefined1 *)(((long)p_Var9 - (long)p_Var13) / 0x18)) {
        lVar21 = 8;
        uVar24 = 0;
        local_40 = pmVar17;
        while( true ) {
          pvVar12 = p_Var13[(long)pmVar17].vertex_indices.
                    super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar5 = ((long)p_Var13[(long)pmVar17].vertex_indices.
                         super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar12) / 0xc;
          if (uVar5 <= uVar24) break;
          idx2.normal_index = *(int *)((long)pvVar12 + lVar21 + -8);
          idx2.texcoord_index = *(int *)((long)&pvVar12->v_idx + lVar21);
          std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::push_back
                    (&(shape->lines).indices,(value_type *)&idx2.normal_index);
          uVar24 = uVar24 + 1;
          p_Var13 = (pPStack_48->lineGroup).
                    super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          lVar21 = lVar21 + 0xc;
        }
        idx2.normal_index = (int)uVar5;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  (&(shape->lines).num_line_vertices,&idx2.normal_index);
        p_Var13 = (pPStack_48->lineGroup).
                  super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>._M_impl.
                  super__Vector_impl_data._M_start;
        p_Var9 = (pPStack_48->lineGroup).
                 super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pmVar17 = (mesh_t *)
                  ((long)&(local_40->indices).
                          super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                          _M_impl.super__Vector_impl_data._M_start + 1);
      }
    }
    p_Var14 = (pPStack_48->pointsGroup).
              super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>._M_impl.
              super__Vector_impl_data._M_start;
    p_Var10 = (pPStack_48->pointsGroup).
              super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (p_Var14 != p_Var10) {
      for (uVar24 = 0; uVar24 < (ulong)(((long)p_Var10 - (long)p_Var14) / 0x18); uVar24 = uVar24 + 1
          ) {
        lVar21 = 8;
        for (uVar5 = 0;
            pvVar12 = p_Var14[uVar24].vertex_indices.
                      super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                      ._M_impl.super__Vector_impl_data._M_start,
            uVar5 < (ulong)(((long)p_Var14[uVar24].vertex_indices.
                                   super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar12) / 0xc
                           ); uVar5 = uVar5 + 1) {
          idx2.normal_index = *(int *)((long)pvVar12 + lVar21 + -8);
          idx2.texcoord_index = *(int *)((long)&pvVar12->v_idx + lVar21);
          std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::push_back
                    (&(shape->points).indices,(value_type *)&idx2.normal_index);
          p_Var14 = (pPStack_48->pointsGroup).
                    super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          lVar21 = lVar21 + 0xc;
        }
        p_Var10 = (pPStack_48->pointsGroup).
                  super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
    }
  }
  return (bool)(local_32 ^ 1);
LAB_00114bf7:
  uVar11 = ((long)remainingFace.vertex_indices.
                  super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                  ._M_impl.super__Vector_impl_data._M_start - remainingFace._0_8_) / 0xc;
  pfVar2 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar19 = (long)(v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pfVar2 >> 2;
  while( true ) {
    if ((uVar11 < 4) || (uVar7 == 0)) {
      uVar24 = (ulong)(uint)vy[1];
      if ((long)remainingFace.vertex_indices.
                super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                ._M_impl.super__Vector_impl_data._M_start - remainingFace._0_8_ == 0x24) {
        vx[1] = *(real_t *)remainingFace._0_8_;
        idx0.normal_index = *(int *)(remainingFace._0_8_ + 0xc);
        idx1.normal_index = *(int *)(remainingFace._0_8_ + 0x18);
        stack0xffffffffffffff58 =
             CONCAT44(*(undefined4 *)(remainingFace._0_8_ + 4),
                      *(undefined4 *)(remainingFace._0_8_ + 8));
        stack0xffffffffffffff64 =
             CONCAT44(*(undefined4 *)(remainingFace._0_8_ + 0x10),
                      *(undefined4 *)(remainingFace._0_8_ + 0x14));
        stack0xffffffffffffff70 =
             CONCAT44(*(undefined4 *)(remainingFace._0_8_ + 0x1c),
                      *(undefined4 *)(remainingFace._0_8_ + 0x20));
        std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::push_back
                  (&local_40->indices,(value_type *)(vx + 1));
        std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::push_back
                  (&local_40->indices,(value_type *)&idx0.normal_index);
        std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::push_back
                  (&local_40->indices,(value_type *)&idx1.normal_index);
        local_31 = '\x03';
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (stack0xffffffffffffff30,&local_31);
        std::vector<int,_std::allocator<int>_>::push_back(this,&local_4c);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (this_00,&__x->smoothing_group_id);
      }
      std::_Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::
      ~_Vector_base((_Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                     *)&remainingFace);
      pvVar12 = remainingFace.vertex_indices.
                super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      goto LAB_00114ff2;
    }
    uVar16 = uVar11;
    if (uVar18 < uVar11) {
      uVar16 = 0;
    }
    uVar18 = uVar18 - uVar16;
    piVar20 = &idx2.normal_index;
    for (lVar21 = 0; lVar21 != 3; lVar21 = lVar21 + 1) {
      lVar6 = ((uVar18 + lVar21) % uVar11) * 0xc;
      piVar20[2] = *(undefined4 *)(remainingFace._0_8_ + 8 + lVar6);
      uVar3 = *(undefined8 *)(remainingFace._0_8_ + lVar6);
      *(undefined8 *)piVar20 = uVar3;
      lVar6 = (long)(int)uVar3 * 3;
      uVar16 = lVar6 + uVar24;
      if ((uVar16 < uVar19) && (uVar22 = lVar6 + lStack_120, uVar22 < uVar19)) {
        local_b8[lVar21] = pfVar2[uVar16];
        fVar27 = pfVar2[uVar22];
      }
      else {
        local_b8[lVar21] = 0.0;
        fVar27 = 0.0;
      }
      local_e0[lVar21] = fVar27;
      piVar20 = piVar20 + 3;
    }
    uVar7 = uVar7 - 1;
    if (uVar5 != uVar11) {
      uVar7 = uVar11;
    }
    uVar5 = uVar11;
    if (0.0 <= ((vy[0] - local_e0[1]) * (local_b8[1] - local_b8[0]) -
               (vx[0] - local_b8[1]) * (local_e0[1] - local_e0[0])) * fVar26) break;
LAB_00114d10:
    uVar18 = uVar18 + 1;
  }
  for (uVar16 = 3; uVar16 != uVar11; uVar16 = uVar16 + 1) {
    lVar21 = (long)*(int *)(remainingFace._0_8_ + ((uVar16 + uVar18) % uVar11) * 0xc) * 3;
    uVar22 = lVar21 + uVar24;
    if ((uVar22 < uVar19) && (uVar8 = lVar21 + lStack_120, uVar8 < uVar19)) {
      fVar27 = pfVar2[uVar8];
      bVar25 = false;
      lVar21 = 2;
      for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
        fVar28 = local_e0[lVar6];
        if ((fVar27 < fVar28 == local_e0[lVar21] <= fVar27) &&
           (pfVar2[uVar22] <
            ((fVar27 - fVar28) * (local_b8[lVar21] - local_b8[lVar6])) / (local_e0[lVar21] - fVar28)
            + local_b8[lVar6])) {
          bVar25 = !bVar25;
        }
        lVar21 = lVar6;
      }
      if (bVar25) goto LAB_00114d10;
    }
  }
  vx[1] = (real_t)idx2.normal_index;
  register0x00000000 =
       CONCAT44(0xffffffff,idx2.texcoord_index) << 0x20 |
       CONCAT44(0xffffffff,idx2.texcoord_index) >> 0x20;
  register0x00000008 = 0xffffffffffffffff;
  idx0.normal_index = -1;
  idx1.normal_index = -1;
  register0x00000000 = 0xffffffffffffffff;
  std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::push_back
            (&local_40->indices,(value_type *)(vx + 1));
  std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::push_back
            (&local_40->indices,(value_type *)&idx0.normal_index);
  std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::push_back
            (&local_40->indices,(value_type *)&idx1.normal_index);
  local_31 = '\x03';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (stack0xffffffffffffff30,&local_31);
  std::vector<int,_std::allocator<int>_>::push_back(this,&local_4c);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (this_00,&__x->smoothing_group_id);
  uVar19 = (uVar18 + 1) % uVar11;
  while (uVar16 = uVar19 + 1, uVar16 < uVar11) {
    *(undefined4 *)(remainingFace._0_8_ + 8 + uVar19 * 0xc) =
         *(undefined4 *)(remainingFace._0_8_ + 8 + uVar16 * 0xc);
    *(undefined8 *)(remainingFace._0_8_ + uVar19 * 0xc) =
         *(undefined8 *)(remainingFace._0_8_ + uVar16 * 0xc);
    uVar19 = uVar16;
  }
  remainingFace.vertex_indices.
  super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>._M_impl.
  super__Vector_impl_data._M_start =
       remainingFace.vertex_indices.
       super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>._M_impl
       .super__Vector_impl_data._M_start + -1;
  goto LAB_00114bf7;
LAB_00114b68:
  fVar26 = fVar26 + (pfVar2[uVar19] * pfVar2[uVar22] - pfVar2[uVar11] * pfVar2[uVar16]) * 0.5;
  goto LAB_00114b06;
}

Assistant:

static bool exportGroupsToShape(shape_t *shape, const PrimGroup &prim_group,
                                const std::vector<tag_t> &tags,
                                const int material_id, const std::string &name,
                                bool triangulate,
                                const std::vector<real_t> &v) {
  if (prim_group.IsEmpty()) {
    return false;
  }

  shape->name = name;

  // polygon
  if (!prim_group.faceGroup.empty()) {
    // Flatten vertices and indices
    for (size_t i = 0; i < prim_group.faceGroup.size(); i++) {
      const face_t &face = prim_group.faceGroup[i];

      size_t npolys = face.vertex_indices.size();

      if (npolys < 3) {
        // Face must have 3+ vertices.
        continue;
      }

      vertex_index_t i0 = face.vertex_indices[0];
      vertex_index_t i1(-1);
      vertex_index_t i2 = face.vertex_indices[1];

      if (triangulate) {
        // find the two axes to work in
        size_t axes[2] = {1, 2};
        for (size_t k = 0; k < npolys; ++k) {
          i0 = face.vertex_indices[(k + 0) % npolys];
          i1 = face.vertex_indices[(k + 1) % npolys];
          i2 = face.vertex_indices[(k + 2) % npolys];
          size_t vi0 = size_t(i0.v_idx);
          size_t vi1 = size_t(i1.v_idx);
          size_t vi2 = size_t(i2.v_idx);

          if (((3 * vi0 + 2) >= v.size()) || ((3 * vi1 + 2) >= v.size()) ||
              ((3 * vi2 + 2) >= v.size())) {
            // Invalid triangle.
            // FIXME(syoyo): Is it ok to simply skip this invalid triangle?
            continue;
          }
          real_t v0x = v[vi0 * 3 + 0];
          real_t v0y = v[vi0 * 3 + 1];
          real_t v0z = v[vi0 * 3 + 2];
          real_t v1x = v[vi1 * 3 + 0];
          real_t v1y = v[vi1 * 3 + 1];
          real_t v1z = v[vi1 * 3 + 2];
          real_t v2x = v[vi2 * 3 + 0];
          real_t v2y = v[vi2 * 3 + 1];
          real_t v2z = v[vi2 * 3 + 2];
          real_t e0x = v1x - v0x;
          real_t e0y = v1y - v0y;
          real_t e0z = v1z - v0z;
          real_t e1x = v2x - v1x;
          real_t e1y = v2y - v1y;
          real_t e1z = v2z - v1z;
          real_t cx = std::fabs(e0y * e1z - e0z * e1y);
          real_t cy = std::fabs(e0z * e1x - e0x * e1z);
          real_t cz = std::fabs(e0x * e1y - e0y * e1x);
          const real_t epsilon = std::numeric_limits<real_t>::epsilon();
          if (cx > epsilon || cy > epsilon || cz > epsilon) {
            // found a corner
            if (cx > cy && cx > cz) {
            } else {
              axes[0] = 0;
              if (cz > cx && cz > cy) axes[1] = 1;
            }
            break;
          }
        }

        real_t area = 0;
        for (size_t k = 0; k < npolys; ++k) {
          i0 = face.vertex_indices[(k + 0) % npolys];
          i1 = face.vertex_indices[(k + 1) % npolys];
          size_t vi0 = size_t(i0.v_idx);
          size_t vi1 = size_t(i1.v_idx);
          if (((vi0 * 3 + axes[0]) >= v.size()) ||
              ((vi0 * 3 + axes[1]) >= v.size()) ||
              ((vi1 * 3 + axes[0]) >= v.size()) ||
              ((vi1 * 3 + axes[1]) >= v.size())) {
            // Invalid index.
            continue;
          }
          real_t v0x = v[vi0 * 3 + axes[0]];
          real_t v0y = v[vi0 * 3 + axes[1]];
          real_t v1x = v[vi1 * 3 + axes[0]];
          real_t v1y = v[vi1 * 3 + axes[1]];
          area += (v0x * v1y - v0y * v1x) * static_cast<real_t>(0.5);
        }

        face_t remainingFace = face;  // copy
        size_t guess_vert = 0;
        vertex_index_t ind[3];
        real_t vx[3];
        real_t vy[3];

        // How many iterations can we do without decreasing the remaining
        // vertices.
        size_t remainingIterations = face.vertex_indices.size();
        size_t previousRemainingVertices = remainingFace.vertex_indices.size();

        while (remainingFace.vertex_indices.size() > 3 &&
               remainingIterations > 0) {
          npolys = remainingFace.vertex_indices.size();
          if (guess_vert >= npolys) {
            guess_vert -= npolys;
          }

          if (previousRemainingVertices != npolys) {
            // The number of remaining vertices decreased. Reset counters.
            previousRemainingVertices = npolys;
            remainingIterations = npolys;
          } else {
            // We didn't consume a vertex on previous iteration, reduce the
            // available iterations.
            remainingIterations--;
          }

          for (size_t k = 0; k < 3; k++) {
            ind[k] = remainingFace.vertex_indices[(guess_vert + k) % npolys];
            size_t vi = size_t(ind[k].v_idx);
            if (((vi * 3 + axes[0]) >= v.size()) ||
                ((vi * 3 + axes[1]) >= v.size())) {
              // ???
              vx[k] = static_cast<real_t>(0.0);
              vy[k] = static_cast<real_t>(0.0);
            } else {
              vx[k] = v[vi * 3 + axes[0]];
              vy[k] = v[vi * 3 + axes[1]];
            }
          }
          real_t e0x = vx[1] - vx[0];
          real_t e0y = vy[1] - vy[0];
          real_t e1x = vx[2] - vx[1];
          real_t e1y = vy[2] - vy[1];
          real_t cross = e0x * e1y - e0y * e1x;
          // if an internal angle
          if (cross * area < static_cast<real_t>(0.0)) {
            guess_vert += 1;
            continue;
          }

          // check all other verts in case they are inside this triangle
          bool overlap = false;
          for (size_t otherVert = 3; otherVert < npolys; ++otherVert) {
            size_t idx = (guess_vert + otherVert) % npolys;

            if (idx >= remainingFace.vertex_indices.size()) {
              // ???
              continue;
            }

            size_t ovi = size_t(remainingFace.vertex_indices[idx].v_idx);

            if (((ovi * 3 + axes[0]) >= v.size()) ||
                ((ovi * 3 + axes[1]) >= v.size())) {
              // ???
              continue;
            }
            real_t tx = v[ovi * 3 + axes[0]];
            real_t ty = v[ovi * 3 + axes[1]];
            if (pnpoly(3, vx, vy, tx, ty)) {
              overlap = true;
              break;
            }
          }

          if (overlap) {
            guess_vert += 1;
            continue;
          }

          // this triangle is an ear
          {
            index_t idx0, idx1, idx2;
            idx0.vertex_index = ind[0].v_idx;
            idx0.normal_index = ind[0].vn_idx;
            idx0.texcoord_index = ind[0].vt_idx;
            idx1.vertex_index = ind[1].v_idx;
            idx1.normal_index = ind[1].vn_idx;
            idx1.texcoord_index = ind[1].vt_idx;
            idx2.vertex_index = ind[2].v_idx;
            idx2.normal_index = ind[2].vn_idx;
            idx2.texcoord_index = ind[2].vt_idx;

            shape->mesh.indices.push_back(idx0);
            shape->mesh.indices.push_back(idx1);
            shape->mesh.indices.push_back(idx2);

            shape->mesh.num_face_vertices.push_back(3);
            shape->mesh.material_ids.push_back(material_id);
            shape->mesh.smoothing_group_ids.push_back(face.smoothing_group_id);
          }

          // remove v1 from the list
          size_t removed_vert_index = (guess_vert + 1) % npolys;
          while (removed_vert_index + 1 < npolys) {
            remainingFace.vertex_indices[removed_vert_index] =
                remainingFace.vertex_indices[removed_vert_index + 1];
            removed_vert_index += 1;
          }
          remainingFace.vertex_indices.pop_back();
        }

        if (remainingFace.vertex_indices.size() == 3) {
          i0 = remainingFace.vertex_indices[0];
          i1 = remainingFace.vertex_indices[1];
          i2 = remainingFace.vertex_indices[2];
          {
            index_t idx0, idx1, idx2;
            idx0.vertex_index = i0.v_idx;
            idx0.normal_index = i0.vn_idx;
            idx0.texcoord_index = i0.vt_idx;
            idx1.vertex_index = i1.v_idx;
            idx1.normal_index = i1.vn_idx;
            idx1.texcoord_index = i1.vt_idx;
            idx2.vertex_index = i2.v_idx;
            idx2.normal_index = i2.vn_idx;
            idx2.texcoord_index = i2.vt_idx;

            shape->mesh.indices.push_back(idx0);
            shape->mesh.indices.push_back(idx1);
            shape->mesh.indices.push_back(idx2);

            shape->mesh.num_face_vertices.push_back(3);
            shape->mesh.material_ids.push_back(material_id);
            shape->mesh.smoothing_group_ids.push_back(face.smoothing_group_id);
          }
        }
      } else {
        for (size_t k = 0; k < npolys; k++) {
          index_t idx;
          idx.vertex_index = face.vertex_indices[k].v_idx;
          idx.normal_index = face.vertex_indices[k].vn_idx;
          idx.texcoord_index = face.vertex_indices[k].vt_idx;
          shape->mesh.indices.push_back(idx);
        }

        shape->mesh.num_face_vertices.push_back(
            static_cast<unsigned char>(npolys));
        shape->mesh.material_ids.push_back(material_id);  // per face
        shape->mesh.smoothing_group_ids.push_back(
            face.smoothing_group_id);  // per face
      }
    }

    shape->mesh.tags = tags;
  }

  // line
  if (!prim_group.lineGroup.empty()) {
    // Flatten indices
    for (size_t i = 0; i < prim_group.lineGroup.size(); i++) {
      for (size_t j = 0; j < prim_group.lineGroup[i].vertex_indices.size();
           j++) {
        const vertex_index_t &vi = prim_group.lineGroup[i].vertex_indices[j];

        index_t idx;
        idx.vertex_index = vi.v_idx;
        idx.normal_index = vi.vn_idx;
        idx.texcoord_index = vi.vt_idx;

        shape->lines.indices.push_back(idx);
      }

      shape->lines.num_line_vertices.push_back(
          int(prim_group.lineGroup[i].vertex_indices.size()));
    }
  }

  // points
  if (!prim_group.pointsGroup.empty()) {
    // Flatten & convert indices
    for (size_t i = 0; i < prim_group.pointsGroup.size(); i++) {
      for (size_t j = 0; j < prim_group.pointsGroup[i].vertex_indices.size();
           j++) {
        const vertex_index_t &vi = prim_group.pointsGroup[i].vertex_indices[j];

        index_t idx;
        idx.vertex_index = vi.v_idx;
        idx.normal_index = vi.vn_idx;
        idx.texcoord_index = vi.vt_idx;

        shape->points.indices.push_back(idx);
      }
    }
  }

  return true;
}